

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_RsbUpdateAdd(Gia_RsbMan_t *p,int iObj)

{
  byte bVar1;
  int nSizeNew;
  uint Entry;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  word *pwVar2;
  byte bVar3;
  int iVar4;
  int i;
  int i_00;
  long lVar5;
  
  bVar3 = (byte)p->vObjs->nSize;
  bVar1 = bVar3 & 0x1f;
  iVar4 = 1 << bVar1;
  if (p->vSets[0]->nSize != iVar4) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x563,"void Gia_RsbUpdateAdd(Gia_RsbMan_t *, int)");
  }
  if (p->vSets[1]->nSize != iVar4) {
    __assert_fail("Vec_WecSize(p->vSets[1]) == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x564,"void Gia_RsbUpdateAdd(Gia_RsbMan_t *, int)");
  }
  i_00 = 0;
  if (1 << bVar1 < 1) {
    iVar4 = i_00;
  }
  for (; i_00 != iVar4; i_00 = i_00 + 1) {
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      p_00 = Vec_WecPushLevel(p->vSets[lVar5]);
      p_01 = Vec_WecEntry(p->vSets[lVar5],i_00);
      nSizeNew = 0;
      for (i = 0; i < p_01->nSize; i = i + 1) {
        Entry = Vec_IntEntry(p_01,i);
        pwVar2 = Vec_WrdEntryP(p->vSims,p->nWords * iObj);
        if ((pwVar2[(int)Entry >> 6] >> ((ulong)Entry & 0x3f) & 1) == 0) {
          Vec_IntWriteEntry(p_01,nSizeNew,Entry);
          nSizeNew = nSizeNew + 1;
        }
        else {
          Vec_IntPush(p_00,Entry);
        }
      }
      Vec_IntShrink(p_01,nSizeNew);
    }
  }
  Vec_IntPush(p->vObjs,iObj);
  iVar4 = p->vSets[0]->nSize;
  if (iVar4 != 2 << (bVar3 & 0x1f)) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == 2*nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x577,"void Gia_RsbUpdateAdd(Gia_RsbMan_t *, int)");
  }
  if (p->vSets[1]->nSize != iVar4) {
    __assert_fail("Vec_WecSize(p->vSets[1]) == 2*nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x578,"void Gia_RsbUpdateAdd(Gia_RsbMan_t *, int)");
  }
  return;
}

Assistant:

void Gia_RsbUpdateAdd( Gia_RsbMan_t * p, int iObj )
{
    int n, i, nLeaves = 1 << Vec_IntSize(p->vObjs);
    assert( Vec_WecSize(p->vSets[0]) == nLeaves );
    assert( Vec_WecSize(p->vSets[1]) == nLeaves );
    for ( i = 0; i < nLeaves; i++ )
    {
        for ( n = 0; n < 2; n++ )
        {
            Vec_Int_t * vLevelN = Vec_WecPushLevel(p->vSets[n]);  
            Vec_Int_t * vLevel  = Vec_WecEntry(p->vSets[n], i);
            int iMint, j, k = 0;
            Vec_IntForEachEntry( vLevel, iMint, j )
            {
                if ( Abc_TtGetBit(Vec_WrdEntryP(p->vSims, p->nWords*iObj), iMint) )
                    Vec_IntPush( vLevelN, iMint );
                else
                    Vec_IntWriteEntry( vLevel, k++, iMint );
            }
            Vec_IntShrink( vLevel, k );
        }
    }
    Vec_IntPush( p->vObjs, iObj );
    assert( Vec_WecSize(p->vSets[0]) == 2*nLeaves );
    assert( Vec_WecSize(p->vSets[1]) == 2*nLeaves );
}